

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieparser.cpp
# Opt level: O2

void __thiscall LottieParserImpl::SkipOut(LottieParserImpl *this,int depth)

{
  do {
    switch((this->super_LookaheadParserHandler).st_) {
    case kError:
      goto switchD_0012eacb_caseD_1;
    case kEnteringObject:
    case kEnteringArray:
      depth = depth + 1;
      break;
    case kExitingObject:
    case kExitingArray:
      depth = depth + -1;
    }
    ParseNext(this);
  } while (0 < depth);
switchD_0012eacb_caseD_1:
  return;
}

Assistant:

void LottieParserImpl::SkipOut(int depth)
{
    do {
        if (st_ == kEnteringArray || st_ == kEnteringObject) {
            ++depth;
        } else if (st_ == kExitingArray || st_ == kExitingObject) {
            --depth;
        } else if (st_ == kError) {
            return;
        }

        ParseNext();
    } while (depth > 0);
}